

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O1

void SetSubMatid(TPZGeoEl *gel,int matid)

{
  int iVar1;
  TPZGeoEl *gel_00;
  int iVar2;
  
  iVar1 = (**(code **)(*(long *)gel + 0x148))();
  if (0 < iVar1) {
    iVar2 = 0;
    do {
      gel_00 = (TPZGeoEl *)(**(code **)(*(long *)gel + 0x1f8))(gel,iVar2);
      gel_00->fMatId = matid;
      SetSubMatid(gel_00,matid);
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  return;
}

Assistant:

static void SetSubMatid(TPZGeoEl *gel, int matid)
{
    int nsub = gel->NSubElements();
    for (int isub=0; isub < nsub; isub++) {
        TPZGeoEl *subel = gel->SubElement(isub);
        subel->SetMaterialId(matid);
        SetSubMatid(subel, matid);
    }
}